

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RouterAccess.cpp
# Opt level: O3

bool __thiscall bhf::ads::RouterAccess::PciScan(RouterAccess *this,uint64_t pci_id,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  bool bVar4;
  string local_10f0;
  uint32_t bytesRead;
  SearchPciBusReq req;
  stringstream stream;
  long local_10b0 [3];
  uint auStack_1098 [22];
  ios_base local_1040 [268];
  SearchPciBusResNew res;
  
  memset(&res,0,0xf04);
  req.leVendorID = (uint16_t)(pci_id >> 0x30);
  req.leDeviceID = (uint16_t)(pci_id >> 0x20);
  req.leSubVendorID = (uint16_t)(pci_id >> 0x10);
  req.leSubSystemID = (uint16_t)pci_id;
  lVar1 = AdsDevice::ReadWriteReqEx2(&this->device,5,3,0xf04,&res,8,&req,&bytesRead);
  if (lVar1 == 0) {
    if (0x40 < res.leFound) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_10b0,"PciScan",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_10b0,"(): data seems corrupt. Slot count 0x",0x25);
      *(uint *)((long)auStack_1098 + *(long *)(local_10b0[0] + -0x18)) =
           *(uint *)((long)auStack_1098 + *(long *)(local_10b0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_10b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," exceeds maximum 0x",0x13);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> truncating\n",0xf);
      std::__cxx11::stringbuf::str();
      Logger::Log(2,&local_10f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_10f0._M_dataplus._M_p._1_7_,local_10f0._M_dataplus._M_p._0_1_) !=
          &local_10f0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_10f0._M_dataplus._M_p._1_7_,local_10f0._M_dataplus._M_p._0_1_
                                ));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      std::ios_base::~ios_base(local_1040);
    }
    uVar3 = 0x40;
    if (res.leFound < 0x40) {
      uVar3 = (ulong)res.leFound;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"PCI devices found: ",0x13);
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    stream = (stringstream)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&stream,1);
    if (res.leFound != 0) {
      lVar1 = 0;
      do {
        poVar2 = operator<<(os,(SearchPciSlotResNew *)
                               ((long)res.slot._M_elems[0].leBaseAddresses._M_elems + lVar1));
        stream = (stringstream)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&stream,1);
        if (lVar1 == 0xec4) break;
        bVar4 = uVar3 * 0x3c + -0x3c != lVar1;
        lVar1 = lVar1 + 0x3c;
      } while (bVar4);
    }
    bVar4 = *(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_10b0,"PciScan",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_10b0,"(): failed with: 0x",0x13);
    *(uint *)((long)auStack_1098 + *(long *)(local_10b0[0] + -0x18)) =
         *(uint *)((long)auStack_1098 + *(long *)(local_10b0[0] + -0x18)) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<long>((long)local_10b0);
    local_10f0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_10f0,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_10f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_10f0._M_dataplus._M_p._1_7_,local_10f0._M_dataplus._M_p._0_1_) !=
        &local_10f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_10f0._M_dataplus._M_p._1_7_,local_10f0._M_dataplus._M_p._0_1_))
      ;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    std::ios_base::~ios_base(local_1040);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool RouterAccess::PciScan(const uint64_t pci_id, std::ostream& os) const
{
#define ROUTERADSGRP_ACCESS_HARDWARE 0x00000005
#define ROUTERADSOFFS_A_HW_SEARCHPCIBUS 0x00000003

    SearchPciBusResNew res {};
    uint32_t bytesRead;

    const auto req = SearchPciBusReq {pci_id};
    const auto status = device.ReadWriteReqEx2(
        ROUTERADSGRP_ACCESS_HARDWARE,
        ROUTERADSOFFS_A_HW_SEARCHPCIBUS,
        sizeof(res), &res,
        sizeof(req), &req,
        &bytesRead
        );

    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return false;
    }

    if (res.slot.size() < res.nFound()) {
        LOG_WARN(__FUNCTION__
                 << "(): data seems corrupt. Slot count 0x" << std::hex << res.nFound() << " exceeds maximum 0x" << res.slot.size() <<
                 " -> truncating\n");
    }

    auto limit = std::min<size_t>(res.slot.size(), res.nFound());
    os << "PCI devices found: " << std::dec << limit << '\n';
    for (const auto& slot: res.slot) {
        if (!limit--) {
            break;
        }
        os << slot << '\n';
    }
    return !os.good();
}